

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcomparehelpers.h
# Opt level: O3

bool qt_qdnsservicerecord_less_than(QDnsServiceRecord *r1,QDnsServiceRecord *r2)

{
  ushort uVar1;
  ushort uVar2;
  QDnsServiceRecordPrivate *pQVar3;
  QDnsServiceRecordPrivate *pQVar4;
  bool bVar5;
  
  pQVar3 = (r1->d).d.ptr;
  uVar1 = pQVar3->priority;
  pQVar4 = (r2->d).d.ptr;
  uVar2 = pQVar4->priority;
  bVar5 = true;
  if (uVar2 <= uVar1) {
    if ((uVar1 == uVar2) && (pQVar3->weight == 0)) {
      return pQVar4->weight != 0;
    }
    bVar5 = false;
  }
  return bVar5;
}

Assistant:

constexpr P get() const noexcept { return ptr; }